

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O3

int __thiscall
Imf_2_5::Pxr24Compressor::compress
          (Pxr24Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  ushort uVar1;
  _Rb_tree_color _Var2;
  Pxr24Compressor *pPVar3;
  uint uVar4;
  int iVar5;
  const_iterator cVar6;
  const_iterator cVar7;
  ConstIterator CVar8;
  BaseExc *this_00;
  uchar *puVar9;
  uint uVar10;
  uchar *puVar11;
  int iVar12;
  uchar *puVar13;
  uchar *puVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  ushort *puVar18;
  uchar *puVar19;
  bool bVar20;
  anon_union_4_2_947300a4 u;
  double dVar21;
  uLongf outSize;
  ulong local_60;
  uint local_54;
  int local_50;
  int local_4c;
  Pxr24Compressor *local_48;
  char **local_40;
  ulong local_38;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    local_60._0_4_ = 0;
  }
  else {
    local_4c = (range->max).x;
    if (this->_maxX < local_4c) {
      local_4c = this->_maxX;
    }
    uVar17 = (range->min).y;
    local_54 = (range->max).y;
    if (this->_maxY < (int)local_54) {
      local_54 = this->_maxY;
    }
    puVar19 = this->_tmpBuffer;
    puVar13 = puVar19;
    if ((int)uVar17 <= (int)local_54) {
      local_50 = (range->min).x;
      local_48 = this;
      local_40 = outPtr;
      do {
        pPVar3 = local_48;
        cVar6._M_node = (_Base_ptr)ChannelList::begin(local_48->_channels);
        cVar7._M_node = (_Base_ptr)ChannelList::end(pPVar3->_channels);
        if (cVar6._M_node != cVar7._M_node) {
          local_38 = (ulong)~uVar17;
          do {
            uVar10 = *(uint *)&cVar6._M_node[9]._M_parent;
            if ((int)uVar17 < 0) {
              if (-1 < (int)uVar10) {
                uVar4 = ((int)local_38 + uVar10) / uVar10;
                goto LAB_001ee441;
              }
              uVar4 = (~uVar10 - uVar17) / -uVar10;
            }
            else if ((int)uVar10 < 0) {
              uVar4 = uVar17 / -uVar10;
LAB_001ee441:
              uVar4 = -uVar4;
            }
            else {
              uVar4 = uVar17 / uVar10;
            }
            puVar19 = puVar13;
            if (uVar17 == uVar4 * uVar10) {
              iVar5 = numSamples(*(int *)&cVar6._M_node[9].field_0x4,local_50,local_4c);
              _Var2 = cVar6._M_node[9]._M_color;
              if (_Var2 == 2) {
                puVar9 = puVar13 + iVar5;
                puVar11 = puVar9 + iVar5;
                puVar19 = puVar11 + iVar5;
                if (0 < iVar5) {
                  iVar12 = 0;
                  uVar10 = 0;
                  do {
                    puVar18 = (ushort *)inPtr;
                    lVar16 = 0;
                    do {
                      *(undefined1 *)((long)&local_60 + lVar16) =
                           *(undefined1 *)((long)puVar18 + lVar16);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 4);
                    if ((~(uint)local_60 & 0x7f800000) == 0) {
                      if ((local_60 & 0x7fffff) == 0) {
                        uVar4 = 0x7f8000;
                      }
                      else {
                        uVar4 = (uint)(((uint)local_60 & 0x7fffff) < 0x100) |
                                ((uint)local_60 & 0x7fffff) >> 8 | 0x7f8000;
                      }
                    }
                    else {
                      uVar4 = ((uint)local_60 & 0x80) + ((uint)local_60 & 0x7fffffff);
                      if (0x7f7fffff < uVar4) {
                        uVar4 = (uint)local_60 & 0x7fffffff;
                      }
                      uVar4 = uVar4 >> 8;
                    }
                    uVar4 = (uint)local_60 >> 8 & 0x800000 | uVar4;
                    iVar15 = uVar4 - uVar10;
                    *puVar13 = (uchar)((uint)iVar15 >> 0x10);
                    puVar13 = puVar13 + 1;
                    *puVar9 = (uchar)((uint)iVar15 >> 8);
                    puVar9 = puVar9 + 1;
                    *puVar11 = (uchar)iVar15;
                    puVar11 = puVar11 + 1;
                    iVar12 = iVar12 + 1;
                    inPtr = (char *)(puVar18 + 2);
                    uVar10 = uVar4;
                  } while (iVar12 != iVar5);
                  inPtr = (char *)(puVar18 + 2);
                }
              }
              else if (_Var2 == _S_black) {
                lVar16 = (long)iVar5;
                puVar19 = puVar13 + lVar16 * 2;
                if (0 < iVar5) {
                  uVar10 = 0;
                  do {
                    uVar1 = *(ushort *)inPtr;
                    inPtr = (char *)((long)inPtr + 2);
                    iVar12 = uVar1 - uVar10;
                    *puVar13 = (uchar)((uint)iVar12 >> 8);
                    puVar13[lVar16] = (uchar)iVar12;
                    puVar13 = puVar13 + 1;
                    iVar5 = iVar5 + -1;
                    uVar10 = (uint)uVar1;
                  } while (iVar5 != 0);
                }
              }
              else if (_Var2 == _S_red) {
                puVar9 = puVar13 + iVar5;
                puVar11 = puVar9 + iVar5;
                puVar14 = puVar11 + iVar5;
                puVar19 = puVar14 + iVar5;
                if (0 < iVar5) {
                  iVar15 = 0;
                  iVar12 = 0;
                  do {
                    puVar18 = (ushort *)inPtr;
                    lVar16 = 0;
                    do {
                      *(undefined1 *)((long)&local_60 + lVar16) =
                           *(undefined1 *)((long)puVar18 + lVar16);
                      lVar16 = lVar16 + 1;
                    } while (lVar16 != 4);
                    iVar12 = (uint)local_60 - iVar12;
                    *puVar13 = (uchar)((uint)iVar12 >> 0x18);
                    puVar13 = puVar13 + 1;
                    *puVar9 = (uchar)((uint)iVar12 >> 0x10);
                    puVar9 = puVar9 + 1;
                    *puVar11 = (uchar)((uint)iVar12 >> 8);
                    puVar11 = puVar11 + 1;
                    *puVar14 = (uchar)iVar12;
                    puVar14 = puVar14 + 1;
                    iVar15 = iVar15 + 1;
                    inPtr = (char *)(puVar18 + 2);
                    iVar12 = (uint)local_60;
                  } while (iVar15 != iVar5);
                  inPtr = (char *)(puVar18 + 2);
                }
              }
            }
            puVar13 = puVar19;
            cVar6._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar6._M_node);
            CVar8 = ChannelList::end(local_48->_channels);
          } while ((const_iterator)cVar6._M_node != CVar8._i._M_node);
        }
        bVar20 = uVar17 != local_54;
        uVar17 = uVar17 + 1;
      } while (bVar20);
      puVar19 = local_48->_tmpBuffer;
      this = local_48;
      outPtr = local_40;
    }
    dVar21 = ceil((double)((long)puVar13 - (long)puVar19) * 1.01);
    local_60 = (ulong)((int)dVar21 + 100);
    iVar5 = ::compress(this->_outBuffer,&local_60,puVar19,(long)puVar13 - (long)puVar19);
    if (iVar5 != 0) {
      this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
      Iex_2_5::BaseExc::BaseExc(this_00,"Data compression (zlib) failed.");
      __cxa_throw(this_00,&Iex_2_5::BaseExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
    }
    *outPtr = this->_outBuffer;
  }
  return (uint)local_60;
}

Assistant:

int
Pxr24Compressor::compress (const char *inPtr,
			   int inSize,
			   Box2i range,
			   const char *&outPtr)
{
    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);

    unsigned char *tmpBufferEnd = _tmpBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
	for (ChannelList::ConstIterator i = _channels.begin();
	     i != _channels.end();
	     ++i)
	{
	    const Channel &c = i.channel();

	    if (modp (y, c.ySampling) != 0)
		continue;

	    int n = numSamples (c.xSampling, minX, maxX);

	    unsigned char *ptr[4];
	    unsigned int previousPixel = 0;

	    switch (c.type)
	    {
	      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		ptr[3] = ptr[2] + n;
		tmpBufferEnd = ptr[3] + n;

		for (int j = 0; j < n; ++j)
		{
		    unsigned int pixel;
		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*pPtr++ = *inPtr++;

		    unsigned int diff = pixel - previousPixel;
		    previousPixel = pixel;

		    *(ptr[0]++) = diff >> 24;
		    *(ptr[1]++) = diff >> 16;
		    *(ptr[2]++) = diff >> 8;
		    *(ptr[3]++) = diff;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		tmpBufferEnd = ptr[1] + n;

		for (int j = 0; j < n; ++j)
		{
		    half pixel;

		    pixel = *(const half *) inPtr;
		    inPtr += sizeof (half);

		    unsigned int diff = pixel.bits() - previousPixel;
		    previousPixel = pixel.bits();

		    *(ptr[0]++) = diff >> 8;
		    *(ptr[1]++) = diff;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		tmpBufferEnd = ptr[2] + n;

		for (int j = 0; j < n; ++j)
		{
		    float pixel;
		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*pPtr++ = *inPtr++;

		    unsigned int pixel24 = floatToFloat24 (pixel);
		    unsigned int diff = pixel24 - previousPixel;
		    previousPixel = pixel24;

		    *(ptr[0]++) = diff >> 16;
		    *(ptr[1]++) = diff >> 8;
		    *(ptr[2]++) = diff;
		}

		break;

	      default:

		assert (false);
	    }
	}
    }

    uLongf outSize = int (ceil ((tmpBufferEnd - _tmpBuffer) * 1.01)) + 100;

    if (Z_OK != ::compress ((Bytef *) _outBuffer,
			    &outSize,
			    (const Bytef *) _tmpBuffer,
			    tmpBufferEnd - _tmpBuffer))
    {
	throw IEX_NAMESPACE::BaseExc ("Data compression (zlib) failed.");
    }

    outPtr = _outBuffer;
    return outSize;
}